

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

size_t fnet_socket_bind_all(fnet_sock_t sock_type,fnet_socket_t *ifaces,size_t size,int flags)

{
  int iVar1;
  fnet_socket_t sock;
  ifaddrs *piVar2;
  ulong uVar3;
  int broadcast_enable;
  fnet_socket_t *local_40;
  ifaddrs *ifaddr;
  
  piVar2 = (ifaddrs *)&ifaddr;
  iVar1 = getifaddrs(piVar2);
  if (iVar1 == -1) {
    return 0;
  }
  uVar3 = 0;
  local_40 = ifaces;
  do {
    while( true ) {
      do {
        piVar2 = piVar2->ifa_next;
        if ((piVar2 == (ifaddrs *)0x0) || (size <= uVar3)) {
          freeifaddrs(ifaddr);
          return uVar3;
        }
      } while (((piVar2->ifa_addr == (sockaddr *)0x0) || (piVar2->ifa_addr->sa_family != 2)) ||
              (sock = fnet_socket_create(sock_type), sock == 0xffffffff));
      if ((flags & 1U) == 0) break;
      broadcast_enable = 1;
      iVar1 = setsockopt(sock,1,6,&broadcast_enable,4);
      if (-1 < iVar1) break;
LAB_00102f4e:
      fnet_socket_close(sock);
    }
    iVar1 = bind(sock,(sockaddr *)piVar2->ifa_addr,0x10);
    if (iVar1 < 0) goto LAB_00102f4e;
    local_40[uVar3] = sock;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

size_t fnet_socket_bind_all(fnet_sock_t sock_type, fnet_socket_t *ifaces, size_t size, int flags)
{
    struct ifaddrs *ifaddr, *ifa;

    if (getifaddrs(&ifaddr) == -1)
    {
        FLOG_ERR("getifaddrs failed");
        return 0;
    }

    size_t ifaces_num = 0;

    for (ifa = ifaddr; ifa != NULL; ifa = ifa->ifa_next)
    {
        if (ifaces_num >= size)
            break;

        if (!ifa->ifa_addr)
            continue;

        if (ifa->ifa_addr->sa_family != AF_INET)
            continue;

        // create socket
        fnet_socket_t socket = fnet_socket_create(sock_type);
        if (socket == FNET_INVALID_SOCKET)
        {
            FLOG_ERR("Unable to create socket");
            continue;
        }

        // set flags
        if (flags & FNET_SOCK_BROADCAST)
        {
            int broadcast_enable = 1;
            if(setsockopt(socket, SOL_SOCKET, SO_BROADCAST, &broadcast_enable, sizeof(broadcast_enable)) < 0)
            {
                FLOG_ERR("broadcast options");
                fnet_socket_close(socket);
                continue;
            }
        }

        if (bind(socket, (struct sockaddr_in const *)ifa->ifa_addr, sizeof(struct sockaddr_in)) < 0)
        {
            FLOG_ERR("Socket bind error");
            fnet_socket_close(socket);
            continue;
        }

        // remember
        ifaces[ifaces_num++] = socket;
    }

    freeifaddrs(ifaddr);

    FLOG_INFO("Ifaces: %d\n", ifaces_num);

    return ifaces_num;
}